

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportPdu.cpp
# Opt level: O0

void __thiscall DIS::EventReportPdu::~EventReportPdu(EventReportPdu *this)

{
  EventReportPdu *this_local;
  
  (this->super_SimulationManagementFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__EventReportPdu_002679c0;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::clear(&this->_fixedDatums);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatums);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::~vector
            (&this->_variableDatums);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::~vector(&this->_fixedDatums);
  SimulationManagementFamilyPdu::~SimulationManagementFamilyPdu
            (&this->super_SimulationManagementFamilyPdu);
  return;
}

Assistant:

EventReportPdu::~EventReportPdu()
{
    _fixedDatums.clear();
    _variableDatums.clear();
}